

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.c
# Opt level: O1

int yy_get_next_buffer(void)

{
  char *pcVar1;
  YY_BUFFER_STATE *ppyVar2;
  size_t sVar3;
  char *pcVar4;
  YY_BUFFER_STATE pyVar5;
  char *pcVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  
  pcVar1 = yytext;
  sVar3 = yy_buffer_stack_top;
  ppyVar2 = yy_buffer_stack;
  pcVar6 = yy_buffer_stack[yy_buffer_stack_top]->yy_ch_buf;
  if (pcVar6 + (long)yy_n_chars + 1 < yy_c_buf_p) {
    yy_fatal_error("fatal flex scanner internal error--end of buffer missed");
  }
  if (yy_buffer_stack[yy_buffer_stack_top]->yy_fill_buffer == 0) {
    iVar7 = ((long)yy_c_buf_p - (long)yytext != 1) + 1;
  }
  else {
    iVar10 = (int)yy_c_buf_p + ~(uint)yytext;
    if (0 < iVar10) {
      lVar8 = 0;
      do {
        pcVar6[lVar8] = pcVar1[lVar8];
        lVar8 = lVar8 + 1;
      } while (iVar10 != (int)lVar8);
    }
    pyVar5 = ppyVar2[sVar3];
    if (pyVar5->yy_buffer_status == 2) {
      yy_n_chars = 0;
    }
    else {
      iVar7 = pyVar5->yy_buf_size;
      pcVar6 = yy_c_buf_p;
      while (yy_c_buf_p = pcVar6, -2 < iVar10 - iVar7) {
        pyVar5 = ppyVar2[sVar3];
        pcVar1 = pyVar5->yy_ch_buf;
        if (pyVar5->yy_is_our_buffer == 0) {
          pcVar4 = (char *)0x0;
        }
        else {
          iVar7 = pyVar5->yy_buf_size;
          iVar9 = iVar7;
          if (iVar7 < 1) {
            iVar9 = iVar7 + 7;
            if (-1 < iVar7) {
              iVar9 = iVar7;
            }
            iVar9 = iVar9 >> 3;
          }
          pyVar5->yy_buf_size = iVar9 + iVar7;
          pcVar4 = (char *)realloc(pcVar1,(long)(iVar9 + iVar7 + 2));
        }
        pyVar5->yy_ch_buf = pcVar4;
        if (pcVar4 == (char *)0x0) {
          yy_fatal_error("fatal error - scanner input buffer overflow");
        }
        pcVar6 = pcVar4 + ((int)pcVar6 - (int)pcVar1);
        iVar7 = ppyVar2[sVar3]->yy_buf_size;
      }
      iVar7 = Getc();
      if (iVar7 != -1) {
        yy_buffer_stack[yy_buffer_stack_top]->yy_ch_buf[iVar10] = (char)iVar7;
      }
      yy_n_chars = (int)(iVar7 != -1);
      pyVar5 = yy_buffer_stack[yy_buffer_stack_top];
    }
    pyVar5->yy_n_chars = yy_n_chars;
    iVar7 = 0;
    if (yy_n_chars == 0) {
      if (iVar10 == 0) {
        yyrestart(yyin);
        iVar7 = 1;
      }
      else {
        yy_buffer_stack[yy_buffer_stack_top]->yy_buffer_status = 2;
        iVar7 = 2;
      }
    }
    sVar3 = yy_buffer_stack_top;
    ppyVar2 = yy_buffer_stack;
    iVar10 = yy_n_chars + iVar10;
    if (yy_buffer_stack[yy_buffer_stack_top]->yy_buf_size < iVar10) {
      iVar9 = (yy_n_chars >> 1) + iVar10;
      pcVar6 = (char *)realloc(yy_buffer_stack[yy_buffer_stack_top]->yy_ch_buf,(long)iVar9);
      ppyVar2[sVar3]->yy_ch_buf = pcVar6;
      if (ppyVar2[sVar3]->yy_ch_buf == (char *)0x0) {
        yy_fatal_error("out of dynamic memory in yy_get_next_buffer()");
      }
      ppyVar2[sVar3]->yy_buf_size = iVar9 + -2;
    }
    yy_n_chars = iVar10;
    ppyVar2[sVar3]->yy_ch_buf[iVar10] = '\0';
    ppyVar2[sVar3]->yy_ch_buf[(long)iVar10 + 1] = '\0';
    yytext = ppyVar2[sVar3]->yy_ch_buf;
  }
  return iVar7;
}

Assistant:

static int yy_get_next_buffer (void)
{
    	char *dest = YY_CURRENT_BUFFER_LVALUE->yy_ch_buf;
	char *source = (yytext_ptr);
	int number_to_move, i;
	int ret_val;

	if ( (yy_c_buf_p) > &YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[(yy_n_chars) + 1] )
		YY_FATAL_ERROR(
		"fatal flex scanner internal error--end of buffer missed" );

	if ( YY_CURRENT_BUFFER_LVALUE->yy_fill_buffer == 0 )
		{ /* Don't try to fill the buffer, so this is an EOF. */
		if ( (yy_c_buf_p) - (yytext_ptr) - YY_MORE_ADJ == 1 )
			{
			/* We matched a single character, the EOB, so
			 * treat this as a final EOF.
			 */
			return EOB_ACT_END_OF_FILE;
			}

		else
			{
			/* We matched some text prior to the EOB, first
			 * process it.
			 */
			return EOB_ACT_LAST_MATCH;
			}
		}

	/* Try to read more data. */

	/* First move last chars to start of buffer. */
	number_to_move = (int) ((yy_c_buf_p) - (yytext_ptr) - 1);

	for ( i = 0; i < number_to_move; ++i )
		*(dest++) = *(source++);

	if ( YY_CURRENT_BUFFER_LVALUE->yy_buffer_status == YY_BUFFER_EOF_PENDING )
		/* don't do the read, it's not guaranteed to return an EOF,
		 * just force an EOF
		 */
		YY_CURRENT_BUFFER_LVALUE->yy_n_chars = (yy_n_chars) = 0;

	else
		{
			int num_to_read =
			YY_CURRENT_BUFFER_LVALUE->yy_buf_size - number_to_move - 1;

		while ( num_to_read <= 0 )
			{ /* Not enough room in the buffer - grow it. */

			/* just a shorter name for the current buffer */
			YY_BUFFER_STATE b = YY_CURRENT_BUFFER_LVALUE;

			int yy_c_buf_p_offset =
				(int) ((yy_c_buf_p) - b->yy_ch_buf);

			if ( b->yy_is_our_buffer )
				{
				int new_size = b->yy_buf_size * 2;

				if ( new_size <= 0 )
					b->yy_buf_size += b->yy_buf_size / 8;
				else
					b->yy_buf_size *= 2;

				b->yy_ch_buf = (char *)
					/* Include room in for 2 EOB chars. */
					yyrealloc( (void *) b->yy_ch_buf,
							 (yy_size_t) (b->yy_buf_size + 2)  );
				}
			else
				/* Can't grow it, we don't own it. */
				b->yy_ch_buf = NULL;

			if ( ! b->yy_ch_buf )
				YY_FATAL_ERROR(
				"fatal error - scanner input buffer overflow" );

			(yy_c_buf_p) = &b->yy_ch_buf[yy_c_buf_p_offset];

			num_to_read = YY_CURRENT_BUFFER_LVALUE->yy_buf_size -
						number_to_move - 1;

			}

		if ( num_to_read > YY_READ_BUF_SIZE )
			num_to_read = YY_READ_BUF_SIZE;

		/* Read in more data. */
		YY_INPUT( (&YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[number_to_move]),
			(yy_n_chars), num_to_read );

		YY_CURRENT_BUFFER_LVALUE->yy_n_chars = (yy_n_chars);
		}

	if ( (yy_n_chars) == 0 )
		{
		if ( number_to_move == YY_MORE_ADJ )
			{
			ret_val = EOB_ACT_END_OF_FILE;
			yyrestart( yyin  );
			}

		else
			{
			ret_val = EOB_ACT_LAST_MATCH;
			YY_CURRENT_BUFFER_LVALUE->yy_buffer_status =
				YY_BUFFER_EOF_PENDING;
			}
		}

	else
		ret_val = EOB_ACT_CONTINUE_SCAN;

	if (((yy_n_chars) + number_to_move) > YY_CURRENT_BUFFER_LVALUE->yy_buf_size) {
		/* Extend the array by 50%, plus the number we really need. */
		int new_size = (yy_n_chars) + number_to_move + ((yy_n_chars) >> 1);
		YY_CURRENT_BUFFER_LVALUE->yy_ch_buf = (char *) yyrealloc(
			(void *) YY_CURRENT_BUFFER_LVALUE->yy_ch_buf, (yy_size_t) new_size  );
		if ( ! YY_CURRENT_BUFFER_LVALUE->yy_ch_buf )
			YY_FATAL_ERROR( "out of dynamic memory in yy_get_next_buffer()" );
		/* "- 2" to take care of EOB's */
		YY_CURRENT_BUFFER_LVALUE->yy_buf_size = (int) (new_size - 2);
	}

	(yy_n_chars) += number_to_move;
	YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[(yy_n_chars)] = YY_END_OF_BUFFER_CHAR;
	YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[(yy_n_chars) + 1] = YY_END_OF_BUFFER_CHAR;

	(yytext_ptr) = &YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[0];

	return ret_val;
}